

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doListAttachments(QPDFJob *this,QPDF *pdf)

{
  element_type *key;
  bool bVar1;
  Pipeline *pPVar2;
  _Base_ptr p_Var3;
  allocator<char> local_121;
  QPDFJob *local_120;
  shared_ptr<QPDFFileSpecObjectHelper> efoh;
  QPDFObjGen local_108;
  QPDFLogger local_100;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  undefined1 local_d0 [24];
  _Rb_tree_node_base local_b8;
  QPDFEmbeddedFileDocumentHelper efdh;
  string local_70 [32];
  string local_50;
  
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
  bVar1 = QPDFEmbeddedFileDocumentHelper::hasEmbeddedFiles(&efdh);
  if (bVar1) {
    local_120 = this;
    QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                *)(local_d0 + 0x10),&efdh);
    for (p_Var3 = local_b8._M_left; p_Var3 != &local_b8;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&efoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2))
      ;
      QPDFLogger::getInfo(&local_100,
                          SUB81((((local_120->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)
                          local_100.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,(string *)(p_Var3 + 1));
      pPVar2 = Pipeline::operator<<(pPVar2," -> ");
      key = efoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_121);
      QPDFFileSpecObjectHelper::getEmbeddedFileStream
                ((QPDFFileSpecObjectHelper *)local_d0,(string *)key);
      local_108 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_d0);
      QPDFObjGen::unparse_abi_cxx11_(&local_50,&local_108,',');
      pPVar2 = Pipeline::operator<<(pPVar2,&local_50);
      Pipeline::operator<<(pPVar2,"\n");
      std::__cxx11::string::~string((string *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      std::__cxx11::string::~string(local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_100.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_f0._8_8_ = 0;
      local_f0._M_unused._M_object = &efoh;
      local_d8 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:920:25)>
                 ::_M_invoke;
      local_e0 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:920:25)>
                 ::_M_manager;
      doIfVerbose(local_120,
                  (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_f0);
      std::_Function_base::~_Function_base((_Function_base *)&local_f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&efoh.super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                 *)(local_d0 + 0x10));
  }
  else {
    QPDFLogger::getInfo((QPDFLogger *)(local_d0 + 0x10),
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar2 = Pipeline::operator<<
                       ((Pipeline *)local_d0._16_8_,
                        (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    Pipeline::operator<<(pPVar2," has no embedded files\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8);
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
  return;
}

Assistant:

void
QPDFJob::doListAttachments(QPDF& pdf)
{
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    if (efdh.hasEmbeddedFiles()) {
        for (auto const& i: efdh.getEmbeddedFiles()) {
            std::string const& key = i.first;
            auto efoh = i.second;
            *m->log->getInfo() << key << " -> "
                               << efoh->getEmbeddedFileStream().getObjGen().unparse(',') << "\n";
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                auto desc = efoh->getDescription();
                if (!desc.empty()) {
                    v << "  description: " << desc << "\n";
                }
                v << "  preferred name: " << efoh->getFilename() << "\n";
                v << "  all names:\n";
                for (auto const& i2: efoh->getFilenames()) {
                    v << "    " << i2.first << " -> " << i2.second << "\n";
                }
                v << "  all data streams:\n";
                for (auto const& [key2, value2]: efoh->getEmbeddedFileStreams().as_dictionary()) {
                    if (value2.null()) {
                        continue;
                    }
                    auto efs = QPDFEFStreamObjectHelper(value2);
                    v << "    " << key2 << " -> " << efs.getObjectHandle().getObjGen().unparse(',')
                      << "\n";
                    v << "      creation date: " << efs.getCreationDate() << "\n"
                      << "      modification date: " << efs.getModDate() << "\n"
                      << "      mime type: " << efs.getSubtype() << "\n"
                      << "      checksum: " << QUtil::hex_encode(efs.getChecksum()) << "\n";
                }
            });
        }
    } else {
        *m->log->getInfo() << m->infilename.get() << " has no embedded files\n";
    }
}